

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void etable_migrate(aura_export_table *old,aura_export_table *new)

{
  aura_node *paVar1;
  int iVar2;
  aura_object *src_00;
  aura_object *dst_00;
  aura_object *dst;
  aura_object *src;
  aura_node *node;
  int i;
  aura_export_table *new_local;
  aura_export_table *old_local;
  
  if ((old != (aura_export_table *)0x0) && (new != (aura_export_table *)0x0)) {
    if (old->owner != new->owner) {
      BUG(old->owner,"BUG during export table migration: etable owners are not equal!");
    }
    paVar1 = old->owner;
    for (node._4_4_ = 0; node._4_4_ < old->next; node._4_4_ = node._4_4_ + 1) {
      src_00 = (aura_object *)(old + (long)node._4_4_ * 3 + 1);
      iVar2 = migrate_object(src_00,(aura_object *)(new + (long)node._4_4_ * 3 + 1));
      if (iVar2 == 0) {
        dst_00 = aura_etable_find(new,src_00->name);
        iVar2 = migrate_object(src_00,dst_00);
        if ((iVar2 == 0) &&
           (src_00->calldonecb != (_func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *)0x0)) {
          if (paVar1->object_migration_failed_cb ==
              (_func_void_aura_node_ptr_aura_object_ptr_void_ptr *)0x0) {
            slog(1,3,"Migration of callbacks for object %s failed\n",src_00->name);
            slog(1,3,"Set aura_object_migration_failed_cb() callback to disable this warning\n");
          }
          else {
            (*paVar1->object_migration_failed_cb)(paVar1,src_00,paVar1->object_migration_failed_arg)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void etable_migrate(struct aura_export_table *old, struct aura_export_table *new)
{
	int i;
	struct aura_node *node;

	/* Sanity checking */
	if (!old || !new) /* Nothing to migrate */
		return;
	if (old->owner != new->owner)
		BUG(old->owner, "BUG during export table migration: etable owners are not equal!");

	node = old->owner;

	/* Migration is a complex process. We need to scan tables to see if there are any
	 * differences (e.g. If the node was down for a firmware update) and move all the callbacks and
	 * their arguments to the new table before nuking the old one.
	 *
	 * If return format or arguments formats have changed, we
	 * will NOT migrate anything. This is better than keeping in a potentially broken state.
	 *
	 * The algo is somewhat smart:
	 * We first try one-to-one mapping with the same id, since it's more likely to be the case 99% of the time.
	 * If that fails - we do a hash-search of the name in the new table, and try to migrate our callbacks there
	 *
	 */
	for (i = 0; i < old->next; i++) {
		struct aura_object *src = &old->objects[i];
		struct aura_object *dst = &new->objects[i];

		/* One-to-one mapping */
		if (migrate_object(src, dst))
			continue;

		/* Try hash-search */
		dst = aura_etable_find(new, src->name);
		if (migrate_object(src, dst))
			continue;

		if (src->calldonecb) {
			/* Migration failed, object had a callback set.
			 * We need to notify the application about a potential problem
			 */
			if (node->object_migration_failed_cb) {
				node->object_migration_failed_cb(node, src,
								 node->object_migration_failed_arg);
			} else {
				slog(1, SLOG_WARN,
				     "Migration of callbacks for object %s failed\n", src->name);
				slog(1, SLOG_WARN,
				     "Set aura_object_migration_failed_cb() callback to disable this warning\n");
			}
		}
	}
}